

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O3

int disp_artifact_discoveries(menulist *menu)

{
  short sVar1;
  int iVar2;
  char cVar3;
  nh_menuitem *pnVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  char *pcVar8;
  long lVar9;
  char buf [256];
  char acStack_138 [264];
  
  lVar9 = 0;
  do {
    if (artidisco[lVar9] == '\0') goto LAB_0014d0c7;
    cVar3 = artidisco[lVar9];
    if (lVar9 == 0) {
      iVar7 = menu->icount;
      iVar2 = menu->size;
      pnVar4 = menu->items;
      if (iVar2 <= iVar7) {
        menu->size = iVar2 * 2;
        pnVar4 = (nh_menuitem *)realloc(pnVar4,(long)iVar2 * 0x218);
        menu->items = pnVar4;
        iVar7 = menu->icount;
      }
      pnVar4[iVar7].id = 0;
      pnVar4[iVar7].role = MI_HEADING;
      pnVar4[iVar7].accel = '\0';
      pnVar4[iVar7].group_accel = '\0';
      pnVar4[iVar7].selected = '\0';
      builtin_strncpy(pnVar4[iVar7].caption,"Artifact",8);
      pnVar4[iVar7].caption[8] = 's';
      pnVar4[iVar7].caption[9] = '\0';
      menu->icount = menu->icount + 1;
      cVar3 = artidisco[0];
    }
    sVar1 = artilist[cVar3].otyp;
    pcVar8 = "";
    if (0xffffffdb < (int)cVar3 - 0x25U) {
      pcVar8 = artilist[(uint)(int)cVar3].name;
    }
    pcVar5 = align_str(artilist[cVar3].alignment);
    pcVar6 = simple_typename((int)sVar1);
    sprintf(acStack_138,"  %s [%s %s]",pcVar8,pcVar5,pcVar6);
    iVar7 = menu->icount;
    iVar2 = menu->size;
    pnVar4 = menu->items;
    if (iVar2 <= iVar7) {
      menu->size = iVar2 * 2;
      pnVar4 = (nh_menuitem *)realloc(pnVar4,(long)iVar2 * 0x218);
      menu->items = pnVar4;
      iVar7 = menu->icount;
    }
    pnVar4 = pnVar4 + iVar7;
    pnVar4->id = 0;
    pnVar4->role = MI_TEXT;
    pnVar4->accel = '\0';
    pnVar4->group_accel = '\0';
    pnVar4->selected = '\0';
    strcpy(pnVar4->caption,acStack_138);
    menu->icount = menu->icount + 1;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x24);
  lVar9 = 0x24;
LAB_0014d0c7:
  return (int)lVar9;
}

Assistant:

int disp_artifact_discoveries(
    struct menulist *menu /* supplied by dodiscover() */
    )
{
    int i, m, otyp;
    char buf[BUFSZ];

    for (i = 0; i < NROFARTIFACTS; i++) {
	if (artidisco[i] == 0) break;	/* empty slot implies end of list */
	if (i == 0)
	    add_menuheading(menu, "Artifacts");
	m = artidisco[i];
	otyp = artilist[m].otyp;
	sprintf(buf, "  %s [%s %s]", artiname(m),
		align_str(artilist[m].alignment), simple_typename(otyp));
	add_menutext(menu, buf);
    }
    return i;
}